

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotpperf.c
# Opt level: O3

void print_usage(char *prg)

{
  fprintf(_stderr,"%s - ISO15765-2 protocol performance visualisation.\n",prg);
  fprintf(_stderr,"\nUsage: %s [options] <CAN interface>\n",prg);
  fwrite("Options:\n",9,1,_stderr);
  fwrite("         -s <can_id>  (source can_id. Use 8 digits for extended IDs)\n",0x45,1,_stderr);
  fwrite("         -d <can_id>  (destination can_id. Use 8 digits for extended IDs)\n",0x4a,1,
         _stderr);
  fwrite("         -x <addr>    (extended addressing mode)\n",0x31,1,_stderr);
  fwrite("         -X <addr>    (extended addressing mode (rx addr))\n",0x3b,1,_stderr);
  fwrite("\nCAN IDs and addresses are given and expected in hexadecimal values.\n",0x45,1,_stderr);
  fputc(10,_stderr);
  return;
}

Assistant:

void print_usage(char *prg)
{
	fprintf(stderr, "%s - ISO15765-2 protocol performance visualisation.\n", prg);
	fprintf(stderr, "\nUsage: %s [options] <CAN interface>\n", prg);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "         -s <can_id>  (source can_id. Use 8 digits for extended IDs)\n");
	fprintf(stderr, "         -d <can_id>  (destination can_id. Use 8 digits for extended IDs)\n");
	fprintf(stderr, "         -x <addr>    (extended addressing mode)\n");
	fprintf(stderr, "         -X <addr>    (extended addressing mode (rx addr))\n");
	fprintf(stderr, "\nCAN IDs and addresses are given and expected in hexadecimal values.\n");
	fprintf(stderr, "\n");
}